

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O3

ssize_t __thiscall
chatra::emb::io::ReadStandardFile::read(ReadStandardFile *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t *psVar1;
  FILE *__stream;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  int __fd_00;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar5;
  void *__n;
  
  __stream = (FILE *)(this->super_StandardFileCommon).fp;
  if (__stream == (FILE *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    puVar4[2] = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    puVar4[1] = puVar4 + 3;
    *(undefined1 *)(puVar4 + 3) = 0;
    *puVar4 = &PTR__NativeException_00243b40;
    ppuVar5 = &UnsupportedOperationException::typeinfo;
  }
  else {
    __n = (void *)((this->super_StandardFileCommon).length -
                  (this->super_StandardFileCommon).current);
    if (__buf <= __n) {
      __n = __buf;
    }
    __fd_00 = 1;
    sVar3 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__n,__stream);
    iVar2 = ferror((FILE *)(this->super_StandardFileCommon).fp);
    if (iVar2 == 0) {
      psVar1 = &(this->super_StandardFileCommon).current;
      *psVar1 = *psVar1 + sVar3;
      return sVar3;
    }
    StandardFileCommon::close(&this->super_StandardFileCommon,__fd_00);
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    puVar4[2] = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    *puVar4 = &PTR__NativeException_00242e10;
    puVar4[1] = puVar4 + 3;
    *(undefined1 *)(puVar4 + 3) = 0;
    ppuVar5 = &NativeException::typeinfo;
  }
  __cxa_throw(puVar4,ppuVar5,NativeException::~NativeException);
}

Assistant:

size_t read(uint8_t* dest, size_t length) override {
		if (fp == nullptr)
			throw UnsupportedOperationException();

		length = std::min(length, available());
		auto readBytes = std::fread(dest, 1, length, fp);
		if (std::ferror(fp)) {
			close();
			throw NativeException();
		}
		current += readBytes;
		return readBytes;
	}